

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O2

bool __thiscall cmMessenger::GetSuppressDeprecatedWarnings(cmMessenger *this)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  allocator local_31;
  string local_30;
  
  this_00 = this->State;
  std::__cxx11::string::string((string *)&local_30,"CMAKE_WARN_DEPRECATED",&local_31);
  val = cmState::GetCacheEntryValue(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (val == (char *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = cmSystemTools::IsOff(val);
  }
  return bVar1;
}

Assistant:

bool cmMessenger::GetSuppressDeprecatedWarnings() const
{
  const char* cacheEntryValue =
    this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  return cacheEntryValue && cmSystemTools::IsOff(cacheEntryValue);
}